

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::TrimCapabilitiesPass::addInstructionRequirementsForOpcode
          (TrimCapabilitiesPass *this,Op opcode,CapabilitySet *capabilities,ExtensionSet *extensions
          )

{
  spv_result_t sVar1;
  spv_opcode_desc_t *desc;
  spv_opcode_desc local_20;
  
  if ((0xf < opcode - OpGroupNonUniformIAdd) && (1 < opcode - OpBeginInvocationInterlockEXT)) {
    local_20 = (spv_opcode_desc_t *)0x0;
    sVar1 = AssemblyGrammar::lookupOpcode(&((this->super_Pass).context_)->grammar_,opcode,&local_20)
    ;
    if (sVar1 == SPV_SUCCESS) {
      addSupportedCapabilitiesToSet<spv_opcode_desc_t>(this,local_20,capabilities);
      addSupportedExtensionsToSet<spv_opcode_desc_t>(this,local_20,extensions);
    }
    return;
  }
  return;
}

Assistant:

bool hasOpcodeConflictingCapabilities(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpBeginInvocationInterlockEXT:
    case spv::Op::OpEndInvocationInterlockEXT:
    case spv::Op::OpGroupNonUniformIAdd:
    case spv::Op::OpGroupNonUniformFAdd:
    case spv::Op::OpGroupNonUniformIMul:
    case spv::Op::OpGroupNonUniformFMul:
    case spv::Op::OpGroupNonUniformSMin:
    case spv::Op::OpGroupNonUniformUMin:
    case spv::Op::OpGroupNonUniformFMin:
    case spv::Op::OpGroupNonUniformSMax:
    case spv::Op::OpGroupNonUniformUMax:
    case spv::Op::OpGroupNonUniformFMax:
    case spv::Op::OpGroupNonUniformBitwiseAnd:
    case spv::Op::OpGroupNonUniformBitwiseOr:
    case spv::Op::OpGroupNonUniformBitwiseXor:
    case spv::Op::OpGroupNonUniformLogicalAnd:
    case spv::Op::OpGroupNonUniformLogicalOr:
    case spv::Op::OpGroupNonUniformLogicalXor:
      return true;
    default:
      return false;
  }
}